

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<Fad<long_double>_>::Subtract
          (TPZMatrix<Fad<long_double>_> *this,TPZMatrix<Fad<long_double>_> *A,
          TPZMatrix<Fad<long_double>_> *res)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  long lVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  longdouble *plVar7;
  longdouble *plVar8;
  longdouble *plVar9;
  longdouble *plVar10;
  longdouble *plVar11;
  ulong uVar12;
  long lVar13;
  TPZFMatrix<Fad<long_double>_> ref;
  Fad<long_double> local_198;
  undefined1 local_168 [24];
  longdouble *local_150;
  longdouble local_148;
  undefined1 local_c8 [32];
  longdouble local_a8 [7];
  
  if (((this->super_TPZBaseMatrix).fRow != (A->super_TPZBaseMatrix).fRow) ||
     ((this->super_TPZBaseMatrix).fCol != (A->super_TPZBaseMatrix).fCol)) {
    Error("Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>",(char *)0x0);
  }
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(this);
  iVar4 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])();
  if (CONCAT44(extraout_var,iVar3) == CONCAT44(extraout_var_00,iVar4)) {
    (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(res,this);
    lVar5 = __dynamic_cast(res,&TPZMatrix<Fad<long_double>>::typeinfo,
                           &TPZFMatrix<Fad<long_double>>::typeinfo,0);
    if (lVar5 != 0) {
      lVar5 = __dynamic_cast(A,&TPZMatrix<Fad<long_double>>::typeinfo,
                             &TPZFMatrix<Fad<long_double>>::typeinfo,0);
      lVar6 = __dynamic_cast(this,&TPZMatrix<Fad<long_double>>::typeinfo,
                             &TPZFMatrix<Fad<long_double>>::typeinfo,0);
      if ((lVar6 == 0) || (lVar5 == 0)) {
        lVar5 = (this->super_TPZBaseMatrix).fRow;
        if (lVar5 < 1) {
          return;
        }
        lVar6 = (this->super_TPZBaseMatrix).fCol;
        lVar13 = 0;
        do {
          if (0 < lVar6) {
            lVar5 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (local_c8,this,lVar13,lVar5);
              (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_198,A,lVar13,lVar5);
              uVar2 = local_c8._16_4_;
              iVar3 = local_198.dx_.num_elts;
              local_168._0_10_ = (longdouble)local_c8._0_10_ - local_198.val_;
              uVar1 = local_198.dx_.num_elts;
              if (local_198.dx_.num_elts < (int)local_c8._16_4_) {
                uVar1 = local_c8._16_4_;
              }
              local_168._16_4_ = 0;
              local_150 = (longdouble *)0x0;
              if ((int)uVar1 < 1) {
                local_148 = (longdouble)0;
              }
              else {
                uVar12 = (ulong)uVar1;
                local_168._16_4_ = uVar1;
                plVar7 = (longdouble *)operator_new__(uVar12 << 4);
                local_150 = plVar7;
                local_148 = (longdouble)0;
                plVar8 = (longdouble *)local_c8._24_8_;
                plVar9 = local_198.dx_.ptr_to_data;
                do {
                  plVar10 = plVar8;
                  if (uVar2 == 0) {
                    plVar10 = local_a8;
                  }
                  plVar11 = plVar9;
                  if (iVar3 == 0) {
                    plVar11 = &local_198.defaultVal;
                  }
                  *plVar7 = *plVar10 - *plVar11;
                  plVar7 = plVar7 + 1;
                  plVar9 = plVar9 + 1;
                  plVar8 = plVar8 + 1;
                  uVar12 = uVar12 - 1;
                } while (uVar12 != 0);
              }
              (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (res,lVar13,lVar5,(Fad<long_double> *)local_168);
              Fad<long_double>::~Fad((Fad<long_double> *)local_168);
              Fad<long_double>::~Fad(&local_198);
              Fad<long_double>::~Fad((Fad<long_double> *)local_c8);
              lVar5 = lVar5 + 1;
              lVar6 = (this->super_TPZBaseMatrix).fCol;
            } while (lVar5 < lVar6);
            lVar5 = (this->super_TPZBaseMatrix).fRow;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < lVar5);
        return;
      }
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4a])(this,res,A);
    iVar3 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(A);
    iVar4 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4d])(A);
    TPZFMatrix<Fad<long_double>_>::TPZFMatrix
              ((TPZFMatrix<Fad<long_double>_> *)local_c8,CONCAT44(extraout_var_01,iVar3),1,
               (Fad<long_double> *)CONCAT44(extraout_var_02,iVar4),CONCAT44(extraout_var_01,iVar3));
    Storage((TPZFMatrixRef<Fad<long_double>_> *)local_168,res);
    TPZFMatrix<Fad<long_double>_>::operator-=
              ((TPZFMatrix<Fad<long_double>_> *)local_168,(TPZMatrix<Fad<long_double>_> *)local_c8);
    TPZFMatrixRef<Fad<long_double>_>::~TPZFMatrixRef
              ((TPZFMatrixRef<Fad<long_double>_> *)local_168,&TPZFMatrixRef<Fad<long_double>>::VTT);
    TPZFMatrix<Fad<long_double>_>::~TPZFMatrix((TPZFMatrix<Fad<long_double>_> *)local_c8);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "void TPZMatrix<Fad<long double>>::Subtract(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [T = Fad<long double>]"
             ,0x73);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n",0x2f);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp",
             0x698);
}

Assistant:

void TPZMatrix<TVar>::Subtract(const TPZMatrix<TVar> &A,TPZMatrix<TVar> &res) const {
	
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>" );
	}
	if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)-A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() -= A.Storage();
  }
}